

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

char * c_escape(char *str,curl_off_t len)

{
  byte bVar1;
  byte *pbVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (len == -1) {
    len = strlen(str);
  }
  sVar5 = 2000;
  if (len < 2000) {
    sVar5 = len;
  }
  pbVar2 = (byte *)malloc((ulong)(2000 < len) * 3 + sVar5 * 4 + 1);
  if (pbVar2 != (byte *)0x0) {
    pbVar4 = pbVar2;
    if (len != 0) {
      sVar6 = 0;
      do {
        bVar1 = str[sVar6];
        if (bVar1 < 0xd) {
          if (bVar1 == 9) {
            pbVar4[2] = 0;
            pbVar4[0] = 0x5c;
            pbVar4[1] = 0x74;
            goto LAB_0011ac59;
          }
          if (bVar1 == 10) {
            pbVar4[2] = 0;
            pbVar4[0] = 0x5c;
            pbVar4[1] = 0x6e;
            goto LAB_0011ac59;
          }
LAB_0011ac67:
          ppuVar3 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x40) == 0) {
            curl_msnprintf(pbVar4,5,"\\x%02x",bVar1);
            pbVar4 = pbVar4 + 4;
          }
          else {
            *pbVar4 = bVar1;
            pbVar4 = pbVar4 + 1;
          }
        }
        else {
          if (bVar1 == 0xd) {
            pbVar4[2] = 0;
            pbVar4[0] = 0x5c;
            pbVar4[1] = 0x72;
          }
          else if (bVar1 == 0x22) {
            pbVar4[2] = 0;
            pbVar4[0] = 0x5c;
            pbVar4[1] = 0x22;
          }
          else {
            if (bVar1 != 0x5c) goto LAB_0011ac67;
            pbVar4[2] = 0;
            pbVar4[0] = 0x5c;
            pbVar4[1] = 0x5c;
          }
LAB_0011ac59:
          pbVar4 = pbVar4 + 2;
        }
        sVar6 = sVar6 + 1;
      } while (sVar5 != sVar6);
      if (2000 < len) {
        pbVar4[2] = 0x2e;
        pbVar4[0] = 0x2e;
        pbVar4[1] = 0x2e;
        pbVar4 = pbVar4 + 3;
      }
    }
    *pbVar4 = 0;
  }
  return (char *)pbVar2;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;
  unsigned int cutoff = 0;

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  /* Allocate space based on worst-case */
  escaped = malloc(4 * (size_t)len + 1 + cutoff);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; len; s++, len--) {
    c = *s;
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(!isprint(c)) {
      msnprintf(e, 5, "\\x%02x", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  while(cutoff--)
    *e++ = '.';
  *e = '\0';
  return escaped;
}